

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-io.c
# Opt level: O1

errr borg_keypress(keycode_t k)

{
  int16_t iVar1;
  errr eVar2;
  long lVar3;
  
  iVar1 = borg_key_head;
  if (k == 0) {
    borg_note_internal(false," & Key * *BAD KEY * *");
    eVar2 = -1;
  }
  else {
    lVar3 = (long)borg_key_head;
    borg_key_head = borg_key_head + 1;
    borg_key_queue[lVar3] = k;
    if (iVar1 == 0x1fff) {
      borg_key_head = 0;
    }
    if (borg_key_head == borg_key_tail) {
      borg_oops("overflow");
    }
    eVar2 = 0;
    if (borg_key_tail == 0x2000) {
      borg_key_tail = 0;
      eVar2 = 0;
    }
  }
  return eVar2;
}

Assistant:

errr borg_keypress(keycode_t k)
{
    /* Hack -- Refuse to enqueue "nul" */
    if (!k) {
        borg_note(" & Key * *BAD KEY * *");
        return (-1);
    }

    /* Store the char, advance the queue */
    borg_key_queue[borg_key_head++] = k;

    /* Circular queue, handle wrap */
    if (borg_key_head == KEY_SIZE)
        borg_key_head = 0;

    /* Hack -- Catch overflow (forget oldest) */
    if (borg_key_head == borg_key_tail)
        borg_oops("overflow");

    /* Hack -- Overflow may induce circular queue */
    if (borg_key_tail == KEY_SIZE)
        borg_key_tail = 0;

    /* Success */
    return 0;
}